

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

QJsonObject __thiscall EnumDef::toJson(EnumDef *this,ClassDef *cdef)

{
  bool bVar1;
  QFlags<QtMocConstants::EnumFlags> QVar2;
  long in_RDX;
  uint uVar3;
  QByteArray *value;
  QByteArray *ba;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QJsonArray valueArr;
  undefined8 local_70;
  QArrayDataPointer<char16_t> local_68;
  QJsonValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  local_50.value.n._0_4_ = 0;
  QVar2 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::value
                    ((QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *)(in_RDX + 0x48),
                     (QByteArray *)cdef,(QFlags<QtMocConstants::EnumFlags> *)&local_50);
  uVar3 = (uint)QVar2.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                super_QFlagsStorage<QtMocConstants::EnumFlags>.i |
          (uint)(cdef->super_BaseDef).enumList.d.size;
  QString::fromUtf8<void>((QString *)&local_68,(QByteArray *)cdef);
  QJsonValue::QJsonValue(&local_50,(QString *)&local_68);
  key.m_size = 4;
  key.m_data = "name";
  _valueArr = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key);
  QJsonValueRef::operator=((QJsonValueRef *)&valueArr,&local_50);
  QJsonValue::~QJsonValue(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if ((cdef->super_BaseDef).qualified.d.size != 0) {
    QString::fromUtf8<void>((QString *)&local_68,&(cdef->super_BaseDef).qualified);
    QJsonValue::QJsonValue(&local_50,(QString *)&local_68);
    key_00.m_size = 5;
    key_00.m_data = "alias";
    _valueArr = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_00);
    QJsonValueRef::operator=((QJsonValueRef *)&valueArr,&local_50);
    QJsonValue::~QJsonValue(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if ((cdef->super_BaseDef).classInfoList.d.size != 0) {
    QString::fromUtf8<void>((QString *)&local_68,(QByteArray *)&(cdef->super_BaseDef).classInfoList)
    ;
    QJsonValue::QJsonValue(&local_50,(QString *)&local_68);
    key_01.m_size = 4;
    key_01.m_data = "type";
    _valueArr = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)this,key_01);
    QJsonValueRef::operator=((QJsonValueRef *)&valueArr,&local_50);
    QJsonValue::~QJsonValue(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  QJsonValue::QJsonValue(&local_50,(bool)((byte)uVar3 & 1));
  key_02.m_size = 6;
  key_02.m_data = "isFlag";
  local_68._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_02);
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_50);
  QJsonValue::~QJsonValue(&local_50);
  QJsonValue::QJsonValue(&local_50,SUB41((uVar3 & 2) >> 1,0));
  key_03.m_size = 7;
  key_03.m_data = "isClass";
  local_68._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_03);
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_50);
  QJsonValue::~QJsonValue(&local_50);
  valueArr.a.d.ptr =
       (QExplicitlySharedDataPointer<QCborContainerPrivate>)
       (totally_ordered_wrapper<QCborContainerPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray(&valueArr);
  ba = (QByteArray *)(cdef->super_BaseDef).enumList.d.d;
  for (lVar4 = (long)(cdef->super_BaseDef).enumList.d.ptr * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18)
  {
    QString::fromUtf8<void>((QString *)&local_68,ba);
    QJsonValue::QJsonValue(&local_50,(QString *)&local_68);
    QJsonArray::append(&valueArr,&local_50);
    QJsonValue::~QJsonValue(&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    ba = ba + 1;
  }
  bVar1 = QJsonArray::isEmpty(&valueArr);
  if (!bVar1) {
    QJsonValue::QJsonValue(&local_50,&valueArr);
    key_04.m_size = 6;
    key_04.m_data = "values";
    local_68._0_16_ = QJsonObject::operator[]((QJsonObject *)this,key_04);
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,&local_50);
    QJsonValue::~QJsonValue(&local_50);
  }
  QJsonArray::~QJsonArray(&valueArr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject EnumDef::toJson(const ClassDef &cdef) const
{
    QJsonObject def;
    uint flags = this->flags | cdef.enumDeclarations.value(name);
    def["name"_L1] = QString::fromUtf8(name);
    if (!enumName.isEmpty())
        def["alias"_L1] = QString::fromUtf8(enumName);
    if (!type.isEmpty())
        def["type"_L1] = QString::fromUtf8(type);
    def["isFlag"_L1] = (flags & EnumIsFlag) != 0;
    def["isClass"_L1] = (flags & EnumIsScoped) != 0;

    QJsonArray valueArr;
    for (const QByteArray &value: values)
        valueArr.append(QString::fromUtf8(value));
    if (!valueArr.isEmpty())
        def["values"_L1] = valueArr;

    return def;
}